

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

Alignment QStyleSheetStyle::resolveAlignment(LayoutDirection layDir,Alignment src)

{
  if (((uint)src.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x10) == 0 && layDir != LeftToRight) {
    if (((uint)src.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 1) == 0) {
      if (((uint)src.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 2) != 0) {
        src.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i
             = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               (((uint)src.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xffffffec) + 1);
      }
    }
    else {
      src.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
           ((uint)src.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xffffffec | 2);
    }
    src.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
         ((uint)src.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                super_QFlagsStorage<Qt::AlignmentFlag>.i | 0x10);
  }
  return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)(QFlagsStorageHelper<Qt::AlignmentFlag,_4>)src;
}

Assistant:

Qt::Alignment QStyleSheetStyle::resolveAlignment(Qt::LayoutDirection layDir, Qt::Alignment src)
{
    if (layDir == Qt::LeftToRight || src & Qt::AlignAbsolute)
        return src;

    if (src & Qt::AlignLeft) {
        src &= ~Qt::AlignLeft;
        src |= Qt::AlignRight;
    } else if (src & Qt::AlignRight) {
        src &= ~Qt::AlignRight;
        src |= Qt::AlignLeft;
    }
    src |= Qt::AlignAbsolute;
    return src;
}